

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch.c
# Opt level: O2

int pitch_segment_mix(mixed_segment *segment)

{
  float fVar1;
  undefined8 *puVar2;
  uint32_t i;
  ulong uVar3;
  uint32_t samples;
  float *out;
  float *in;
  
  puVar2 = (undefined8 *)segment->data;
  if ((*(float *)((long)puVar2 + 100) != 1.0) || (NAN(*(float *)((long)puVar2 + 100)))) {
    samples = 0xffffffff;
    fVar1 = *(float *)(puVar2 + 0xd);
    mixed_buffer_request_read(&in,&samples,(mixed_buffer *)*puVar2);
    mixed_buffer_request_write(&out,&samples,(mixed_buffer *)puVar2[1]);
    fft_window_resolver(in,out,samples,puVar2 + 2,fft_pitch_shift_resolver,(long)puVar2 + 100);
    for (uVar3 = 0; samples != uVar3; uVar3 = uVar3 + 1) {
      out[uVar3] = in[uVar3] * (1.0 - fVar1) + out[uVar3] * fVar1;
    }
    mixed_buffer_finish_read(samples,(mixed_buffer *)*puVar2);
    mixed_buffer_finish_write(samples,(mixed_buffer *)puVar2[1]);
  }
  else {
    mixed_buffer_transfer((mixed_buffer *)*puVar2,(mixed_buffer *)puVar2[1]);
  }
  return 1;
}

Assistant:

int pitch_segment_mix(struct mixed_segment *segment){
  struct pitch_segment_data *data = (struct pitch_segment_data *)segment->data;

  if(data->pitch == 1.0){
    mixed_buffer_transfer(data->in, data->out);
  }else{
    float *restrict in, *restrict out;
    uint32_t samples = UINT32_MAX;
    float mix = data->mix;
    mixed_buffer_request_read(&in, &samples, data->in);
    mixed_buffer_request_write(&out, &samples, data->out);
    fft_window(in, out, samples, &data->fft_window_data, fft_pitch_shift, &data->pitch);
    for(uint32_t i=0; i<samples; ++i){
      out[i] = LERP(in[i], out[i], mix);
    }
    mixed_buffer_finish_read(samples, data->in);
    mixed_buffer_finish_write(samples, data->out);
  }
  return 1;
}